

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

bool __thiscall bloaty::ThreadSafeIterIndex::TryGetError(ThreadSafeIterIndex *this,string *error)

{
  size_type sVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    sVar1 = (this->error_)._M_string_length;
    if (sVar1 != 0) {
      std::__cxx11::string::_M_assign((string *)error);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return sVar1 != 0;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool TryGetError(std::string* error) {
    std::lock_guard<std::mutex> lock(mutex_);
    if (error_.empty()) {
      return false;
    } else {
      *error = error_;
      return true;
    }
  }